

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

size_t convert_lineends(Curl_easy *data,char *startPtr,size_t size)

{
  char *local_38;
  char *outPtr;
  char *inPtr;
  size_t size_local;
  char *startPtr_local;
  Curl_easy *data_local;
  
  data_local = (Curl_easy *)size;
  if ((startPtr != (char *)0x0) && (size != 0)) {
    inPtr = (char *)size;
    if (((data->state).prev_block_had_trailing_cr & 1U) != 0) {
      if (*startPtr == '\n') {
        memmove(startPtr,startPtr + 1,size - 1);
        inPtr = (char *)(size - 1);
        (data->state).crlf_conversions = (data->state).crlf_conversions + 1;
      }
      (data->state).prev_block_had_trailing_cr = false;
    }
    local_38 = (char *)memchr(startPtr,0xd,(size_t)inPtr);
    outPtr = local_38;
    if (local_38 == (char *)0x0) {
      data_local = (Curl_easy *)inPtr;
    }
    else {
      for (; outPtr < startPtr + (long)inPtr + -1; outPtr = outPtr + 1) {
        if (*(short *)outPtr == 0xa0d) {
          outPtr = outPtr + 1;
          *local_38 = *outPtr;
          (data->state).crlf_conversions = (data->state).crlf_conversions + 1;
        }
        else if (*outPtr == '\r') {
          *local_38 = '\n';
        }
        else {
          *local_38 = *outPtr;
        }
        local_38 = local_38 + 1;
      }
      if (outPtr < startPtr + (long)inPtr) {
        if (*outPtr == '\r') {
          *local_38 = '\n';
          (data->state).prev_block_had_trailing_cr = true;
        }
        else {
          *local_38 = *outPtr;
        }
        local_38 = local_38 + 1;
      }
      if (local_38 < startPtr + (long)inPtr) {
        *local_38 = '\0';
      }
      data_local = (Curl_easy *)(local_38 + -(long)startPtr);
    }
  }
  return (size_t)data_local;
}

Assistant:

static size_t convert_lineends(struct Curl_easy *data,
                               char *startPtr, size_t size)
{
  char *inPtr, *outPtr;

  /* sanity check */
  if((startPtr == NULL) || (size < 1)) {
    return size;
  }

  if(data->state.prev_block_had_trailing_cr) {
    /* The previous block of incoming data
       had a trailing CR, which was turned into a LF. */
    if(*startPtr == '\n') {
      /* This block of incoming data starts with the
         previous block's LF so get rid of it */
      memmove(startPtr, startPtr + 1, size-1);
      size--;
      /* and it wasn't a bare CR but a CRLF conversion instead */
      data->state.crlf_conversions++;
    }
    data->state.prev_block_had_trailing_cr = FALSE; /* reset the flag */
  }

  /* find 1st CR, if any */
  inPtr = outPtr = memchr(startPtr, '\r', size);
  if(inPtr) {
    /* at least one CR, now look for CRLF */
    while(inPtr < (startPtr + size-1)) {
      /* note that it's size-1, so we'll never look past the last byte */
      if(memcmp(inPtr, "\r\n", 2) == 0) {
        /* CRLF found, bump past the CR and copy the NL */
        inPtr++;
        *outPtr = *inPtr;
        /* keep track of how many CRLFs we converted */
        data->state.crlf_conversions++;
      }
      else {
        if(*inPtr == '\r') {
          /* lone CR, move LF instead */
          *outPtr = '\n';
        }
        else {
          /* not a CRLF nor a CR, just copy whatever it is */
          *outPtr = *inPtr;
        }
      }
      outPtr++;
      inPtr++;
    } /* end of while loop */

    if(inPtr < startPtr + size) {
      /* handle last byte */
      if(*inPtr == '\r') {
        /* deal with a CR at the end of the buffer */
        *outPtr = '\n'; /* copy a NL instead */
        /* note that a CRLF might be split across two blocks */
        data->state.prev_block_had_trailing_cr = TRUE;
      }
      else {
        /* copy last byte */
        *outPtr = *inPtr;
      }
      outPtr++;
    }
    if(outPtr < startPtr + size)
      /* tidy up by null terminating the now shorter data */
      *outPtr = '\0';

    return (outPtr - startPtr);
  }
  return size;
}